

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O0

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  int ret;
  ssize_t max_in;
  ssize_t avail_in;
  size_t decompressed;
  private_data_conflict *state;
  void **p_local;
  archive_read_filter *self_local;
  
  decompressed = (size_t)self->data;
  *(undefined8 *)(decompressed + 0x18) = *(undefined8 *)(decompressed + 0x78);
  *(int *)(decompressed + 0x20) = (int)*(undefined8 *)(decompressed + 0x80);
  state = (private_data_conflict *)p;
  p_local = (void **)self;
  while( true ) {
    bVar4 = false;
    if (*(int *)(decompressed + 0x20) != 0) {
      bVar4 = *(char *)(decompressed + 0xa8) == '\0';
    }
    if (!bVar4) break;
    if (*(char *)(decompressed + 0x70) == '\0') {
      iVar1 = consume_header((archive_read_filter *)p_local);
      if (iVar1 == 1) {
        *(undefined1 *)(decompressed + 0xa8) = 1;
        break;
      }
      if (iVar1 < 0) {
        return (long)iVar1;
      }
    }
    pvVar2 = __archive_read_filter_ahead((archive_read_filter *)p_local[2],1,&max_in);
    *(void **)decompressed = pvVar2;
    if (*(long *)decompressed == 0) {
      archive_set_error((archive *)p_local[3],-1,"truncated gzip input");
      return -0x1e;
    }
    if (0xffffffff < max_in) {
      max_in = 0xffffffff;
    }
    *(undefined4 *)(decompressed + 8) = (undefined4)max_in;
    iVar1 = inflate(decompressed,0);
    if (iVar1 == 0) {
      __archive_read_filter_consume
                ((archive_read_filter *)p_local[2],max_in - (ulong)*(uint *)(decompressed + 8));
    }
    else {
      if (iVar1 != 1) {
        archive_set_error((archive *)p_local[3],-1,"gzip decompression failed");
        return -0x1e;
      }
      __archive_read_filter_consume
                ((archive_read_filter *)p_local[2],max_in - (ulong)*(uint *)(decompressed + 8));
      iVar1 = consume_trailer((archive_read_filter *)p_local);
      if (iVar1 < 0) {
        return (long)iVar1;
      }
    }
  }
  lVar3 = *(long *)(decompressed + 0x18) - *(long *)(decompressed + 0x78);
  *(long *)(decompressed + 0x88) = lVar3 + *(long *)(decompressed + 0x88);
  if (lVar3 == 0) {
    (state->stream).next_in = (Bytef *)0x0;
    return 0;
  }
  (state->stream).next_in = *(Bytef **)(decompressed + 0x78);
  return lVar3;
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in, max_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		if (UINT_MAX >= SSIZE_MAX)
			max_in = SSIZE_MAX;
		else
			max_in = UINT_MAX;
		if (avail_in > max_in)
			avail_in = max_in;
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}